

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O0

void __thiscall RangeLock_LockUnlock_Test::TestBody(RangeLock_LockUnlock_Test *this)

{
  bool bVar1;
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *this_00;
  TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *pTVar2;
  MockSpec<void_(unsigned_long,_unsigned_long)> *this_01;
  TypedExpectation<void_(unsigned_long,_unsigned_long)> *pTVar3;
  char *pcVar4;
  Matcher<pstore::file::file_base::blocking_mode> *gmock_a3;
  string local_630;
  AssertHelper local_610;
  Message local_608;
  bool local_5f9;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_5c8;
  Message local_5c0;
  bool local_5b1;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar_;
  range_lock lock;
  WithoutMatchers local_549;
  Matcher<unsigned_long> local_548;
  Matcher<unsigned_long> local_530;
  MockSpec<void_(unsigned_long,_unsigned_long)> local_518;
  ReturnAction<bool> local_4e0;
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  local_4d0;
  WithoutMatchers local_4a9;
  Matcher<pstore::file::file_base::blocking_mode> local_4a8;
  Matcher<pstore::file::file_base::lock_kind> local_490;
  Matcher<unsigned_long> local_478;
  Matcher<unsigned_long> local_450;
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  local_438;
  undefined1 local_3d0 [8];
  Expectation file_lock;
  mock_file file;
  RangeLock_LockUnlock_Test *this_local;
  
  anon_unknown.dwarf_16883::mock_file::mock_file
            ((mock_file *)
             &file_lock.expectation_base_.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  testing::Matcher<unsigned_long>::Matcher(&local_450,5);
  testing::Matcher<unsigned_long>::Matcher(&local_478,7);
  testing::Matcher<pstore::file::file_base::lock_kind>::Matcher(&local_490,exclusive_write);
  testing::Matcher<pstore::file::file_base::blocking_mode>::Matcher(&local_4a8,blocking);
  gmock_a3 = &local_4a8;
  anon_unknown.dwarf_16883::mock_file::gmock_lock
            (&local_438,
             (mock_file *)
             &file_lock.expectation_base_.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_450,&local_478,&local_490,gmock_a3);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            ::operator()(&local_438,&local_4a9,(void *)0x0);
  pTVar2 = testing::internal::
           MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::InternalExpectedAt
                     (this_00,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                      ,0xfa,"file",
                      "lock (5UL, std::size_t{7}, mock_file::lock_kind::exclusive_write, mock_file::blocking_mode::blocking)"
                     );
  testing::Return<bool>((testing *)&local_4e0,true);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_4d0,(ReturnAction *)&local_4e0);
  pTVar2 = testing::internal::
           TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::WillOnce(pTVar2,&local_4d0);
  testing::Expectation::Expectation((Expectation *)local_3d0,&pTVar2->super_ExpectationBase);
  testing::
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::~Action(&local_4d0);
  testing::internal::ReturnAction<bool>::~ReturnAction(&local_4e0);
  testing::internal::
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::~MockSpec(&local_438);
  testing::Matcher<pstore::file::file_base::blocking_mode>::~Matcher(&local_4a8);
  testing::Matcher<pstore::file::file_base::lock_kind>::~Matcher(&local_490);
  testing::Matcher<unsigned_long>::~Matcher(&local_478);
  testing::Matcher<unsigned_long>::~Matcher(&local_450);
  testing::Matcher<unsigned_long>::Matcher(&local_530,5);
  testing::Matcher<unsigned_long>::Matcher(&local_548,7);
  anon_unknown.dwarf_16883::mock_file::gmock_unlock
            (&local_518,
             (mock_file *)
             &file_lock.expectation_base_.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_530,&local_548);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::operator()
                      (&local_518,&local_549,(void *)0x0);
  pTVar3 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::InternalExpectedAt
                     (this_01,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                      ,0xfc,"file","unlock (5UL, std::size_t{7})");
  pTVar3 = testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::Times(pTVar3,1)
  ;
  testing::ExpectationSet::ExpectationSet((ExpectationSet *)&lock.kind_,(Expectation *)local_3d0);
  testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::After
            (pTVar3,(ExpectationSet *)&lock.kind_);
  testing::ExpectationSet::~ExpectationSet((ExpectationSet *)&lock.kind_);
  testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::~MockSpec(&local_518);
  testing::Matcher<unsigned_long>::~Matcher(&local_548);
  testing::Matcher<unsigned_long>::~Matcher(&local_530);
  pstore::file::range_lock::range_lock
            ((range_lock *)&gtest_ar_.message_,
             (file_base *)
             &file_lock.expectation_base_.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,5,7,exclusive_write);
  pstore::file::range_lock::lock((range_lock *)&gtest_ar_.message_);
  local_5b1 = pstore::file::range_lock::is_locked((range_lock *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b0,&local_5b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_5b0,(AssertionResult *)0x225db3,
               "false","true",(char *)gmock_a3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x103,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5c8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  pstore::file::range_lock::unlock((range_lock *)&gtest_ar_.message_);
  local_5f9 = pstore::file::range_lock::is_locked((range_lock *)&gtest_ar_.message_);
  local_5f9 = !local_5f9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f8,&local_5f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_630,(internal *)local_5f8,(AssertionResult *)0x225db3,"true","false",
               (char *)gmock_a3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x105,pcVar4);
    testing::internal::AssertHelper::operator=(&local_610,&local_608);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    std::__cxx11::string::~string((string *)&local_630);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  pstore::file::range_lock::~range_lock((range_lock *)&gtest_ar_.message_);
  testing::Expectation::~Expectation((Expectation *)local_3d0);
  anon_unknown.dwarf_16883::mock_file::~mock_file
            ((mock_file *)
             &file_lock.expectation_base_.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST (RangeLock, LockUnlock) {
    mock_file file;

    // Set up the test expectations.
    using ::testing::_;
    using ::testing::Expectation;
    using ::testing::Return;

    Expectation file_lock = EXPECT_CALL (file, lock (UINT64_C (5), std::size_t{7},
                                                     mock_file::lock_kind::exclusive_write,
                                                     mock_file::blocking_mode::blocking))
                                .WillOnce (Return (true));
    EXPECT_CALL (file, unlock (UINT64_C (5), std::size_t{7})).Times (1).After (file_lock);

    pstore::file::range_lock lock (&file,
                                   UINT64_C (5),   // offset
                                   std::size_t{7}, // size
                                   mock_file::lock_kind::exclusive_write);
    lock.lock ();
    EXPECT_TRUE (lock.is_locked ());
    lock.unlock ();
    EXPECT_FALSE (lock.is_locked ());
}